

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utility.cpp
# Opt level: O0

char * FIX::socket_peername(socket_handle socket)

{
  int iVar1;
  char *result;
  socklen_t len;
  sockaddr_in addr;
  socket_handle socket_local;
  
  result._0_4_ = 0x10;
  addr.sin_zero._0_4_ = socket;
  iVar1 = getpeername(socket,(sockaddr *)((long)&result + 4),(socklen_t *)&result);
  if (iVar1 < 0) {
    stack0xfffffffffffffff0 = "UNKNOWN";
  }
  else {
    register0x00000000 = inet_ntoa((in_addr)len);
    if (register0x00000000 == (char *)0x0) {
      stack0xfffffffffffffff0 = "UNKNOWN";
    }
  }
  return stack0xfffffffffffffff0;
}

Assistant:

const char *socket_peername(socket_handle socket) {
  struct sockaddr_in addr;
  socklen_t len = sizeof(addr);
  if (getpeername(socket, (struct sockaddr *)&addr, &len) < 0) {
    return "UNKNOWN";
  }
  char *result = inet_ntoa(addr.sin_addr);
  if (result) {
    return result;
  } else {
    return "UNKNOWN";
  }
}